

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O0

void test_filter_or_format(undefined1 *enable)

{
  undefined1 *enable_local;
  
  test_success(archive_read_new,enable,archive_read_free);
  test_failure(archive_write_new,enable,archive_write_free);
  test_failure(archive_read_disk_new,enable,archive_read_free);
  test_failure(archive_write_disk_new,enable,archive_write_free);
  return;
}

Assistant:

static void
test_filter_or_format(enabler enable)
{
	test_success(archive_read_new, enable, archive_read_free);
	test_failure(archive_write_new, enable, archive_write_free);
	test_failure(archive_read_disk_new, enable, archive_read_free);
	test_failure(archive_write_disk_new, enable, archive_write_free);
}